

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O3

void my_deserialization_example(ChArchiveIn *marchive)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined8 *puVar4;
  mapped_type *ppvVar5;
  ChStreamOutAscii *pCVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> vect_of_pointers;
  myEmployee *a_boss;
  int m_int;
  shared_ptr<myEmployeeBoss> s_boss;
  myEmployeeCustomConstructor *mcustomconstr;
  myEmployee *a_boss2;
  vector<double,_std::allocator<double>_> m_stlvector;
  shared_ptr<myEmployeeBoss> null_boss;
  ChVector<double> *a_vect;
  pair<int,_double> m_stlpair;
  double m_double;
  string m_string;
  ChMatrixDynamic<> m_matr_dyn;
  shared_ptr<myEmployeeBoss> s_boss_b;
  ChVector<double> m_vect;
  char m_text [12];
  ChVector<double> *a_null_ptr;
  list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> m_stllist;
  ChQuaternion<double> m_quat;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  m_stlunorderedmap;
  myEmployeeBoss m_boss;
  ChMatrixNM<double,_2,_3> m_matr_NM;
  double m_array [3];
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> local_2a8;
  char *local_290;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_288;
  undefined1 local_280;
  myEmployee *local_278;
  int local_26c;
  shared_ptr<myEmployeeBoss> local_268;
  long local_258;
  long local_250;
  vector<double,_std::allocator<double>_> local_248;
  long local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_220;
  ChVector<double> *local_218;
  undefined1 local_210 [8];
  double local_208;
  double local_200;
  __node_base *local_1f8;
  undefined8 local_1f0;
  __node_base local_1e8 [2];
  ChVector<double> *local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  char local_184 [12];
  ChVector<double> *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined8 local_160;
  ChQuaternion<double> local_158;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_138;
  myEmployeeBoss local_100;
  Matrix<double,_2,_3,_1,_2,_3> local_78;
  undefined1 local_48 [24];
  
  local_138._M_buckets = &local_138._M_single_bucket;
  puVar1 = local_184 + 0x14;
  local_210._0_4_ = 0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_208 = 0.0;
  local_1c8 = 0;
  local_198 = 0;
  local_138._M_bucket_count = 1;
  local_138._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_138._M_element_count = 0;
  local_138._M_rehash_policy._M_max_load_factor = 1.0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138._M_rehash_policy._M_next_resize = 0;
  local_138._M_single_bucket = (__node_base_ptr)0x0;
  local_1d8 = (ChVector<double> *)0x0;
  uStack_1d0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1f0 = 0;
  local_1e8[0]._M_nxt._0_1_ = 0;
  local_160 = 0;
  local_158.m_data = (double  [4])(ZEXT432(0) << 0x40);
  local_1f8 = local_1e8;
  local_170 = puVar1;
  local_168 = puVar1;
  myEmployeeBoss::myEmployeeBoss(&local_100,0x26,9000.4,true);
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_200;
  local_290 = "custom_double";
  local_280 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_26c;
  local_290 = "m_int";
  local_280 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive);
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_48;
  local_290 = "m_array";
  local_280 = 0;
  chrono::ChArchiveIn::in<double,3ul>(marchive,(ChNameValue<double[3]> *)&local_290);
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_184;
  local_290 = "m_text";
  local_280 = 0;
  chrono::ChArchiveIn::in<char,12ul>(marchive,(ChNameValue<char[12]> *)&local_290);
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_1f8;
  local_290 = "m_string";
  local_280 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[8])(marchive);
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_248;
  local_290 = "m_stlvector";
  local_280 = 0;
  chrono::ChArchiveIn::in<double>
            (marchive,(ChNameValue<std::vector<double,_std::allocator<double>_>_> *)&local_290);
  local_290 = "m_stllist";
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)puVar1;
  chrono::ChArchiveIn::in<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)&local_290);
  local_268.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_210;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a728;
  local_290 = "m_stlpair";
  local_280 = 0;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_268;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xc])(marchive);
  local_288 = &local_138;
  local_290 = "m_stlunorderedmap";
  local_280 = 0;
  chrono::ChArchiveIn::in<int,double>
            (marchive,(ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
                       *)&local_290);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = &local_1d8;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a790;
  local_290 = "m_matr_dyn";
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xc])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_78;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a7f8;
  local_290 = "m_matr_NM";
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xc])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_1a8;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a6c0;
  local_290 = "m_vect";
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xc])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_158;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a860;
  local_290 = "m_quaternion";
  local_280 = 1;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xc])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a8c8;
  local_290 = "m_boss";
  local_280 = 0;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_100;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xc])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = &local_218;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a930;
  local_290 = "a_vect";
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xd])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)(local_184 + 0xc);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a930;
  local_290 = "a_null_ptr";
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xd])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_278;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a998;
  local_290 = "a_boss";
  local_278 = (myEmployee *)0x0;
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xd])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_250;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015a998;
  local_290 = "a_boss2";
  local_250 = 0;
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xd])(marchive);
  local_290 = "s_boss";
  local_268.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_268.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_268;
  chrono::ChArchiveIn::in<myEmployeeBoss>
            (marchive,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&local_290);
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_1b8;
  local_290 = "s_boss_b";
  local_1b8 = 0;
  p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_280 = 0;
  chrono::ChArchiveIn::in<myEmployeeBoss>
            (marchive,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&local_290);
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_228;
  local_290 = "null_boss";
  local_228 = 0;
  p_Stack_220 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_280 = 0;
  chrono::ChArchiveIn::in<myEmployeeBoss>
            (marchive,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)&local_290);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_258;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChFunctorArchiveIn_0015aab8;
  local_258 = 0;
  local_290 = "mcustomconstr";
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xd])(marchive);
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar4 = (undefined8 *)operator_new(0x18);
  local_290 = (char *)0x3e9;
  *puVar4 = 0x4014000000000000;
  puVar4[1] = 0x4018000000000000;
  puVar4[2] = 0x401c000000000000;
  ppvVar5 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_void_*>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_void_*>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&marchive->external_id_ptr,(key_type *)&local_290);
  *ppvVar5 = puVar4;
  local_290 = "vect_of_pointers";
  local_280 = 0;
  local_288 = (_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&local_2a8;
  chrono::ChArchiveIn::in<chrono::ChVector<double>*>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
                       *)&local_290);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar6 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar6,"\n\nSome results of deserialization I/O: \n\n");
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,local_184);
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6," \n");
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,local_26c);
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6," \n");
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,local_200);
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,&local_78);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,(ChVector<double> *)&local_1a8);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,&local_158);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,(char *)local_1f8);
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,&local_248);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,(pair<int,_double> *)local_210);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,(unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_138);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,&local_100);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,&local_218);
  if (local_278 != (myEmployee *)0x0) {
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar6,"\n\n We loaded an obj inherited from myEmployee class:\n");
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar6,&local_278);
  }
  if (local_250 != 0) {
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar6,
               "\n\n We loaded a 2nd obj inherited from myEmployee class (referencing the 1st):\n");
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar6,(myEmployee **)&local_250);
  }
  if (local_268.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar6,"\n\n We loaded a 3nd obj inherited from myEmployee class:\n");
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar6,&local_268);
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar6 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar6,"(This object is handled by shared pointers, with ref.count=");
    if (local_268.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar8 = 0;
    }
    else {
      iVar8 = (local_268.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count;
    }
    pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,iVar8);
    chrono::ChStreamOutAscii::operator<<(pCVar6,")\n");
  }
  if (local_228 == 0) {
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar6,"\n\n We tried to load a 4th obj with shared pointer, but was null.\n");
  }
  if (local_258 != 0) {
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar6,
               "\n\n We loaded a 5th object with non-default constructor with 2 parameters.\n");
    pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar6,(myEmployeeCustomConstructor **)&local_258);
  }
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar6,"\n\n We loaded a 6th object where sub-objects were unbind/rebind using IDs:\n")
  ;
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,&local_2a8);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,*local_2a8.
                             super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar6,local_2a8.
                            super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]);
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar6 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar6,"loaded object is a myEmployee?     :");
  pCVar6 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar6,local_278 != (myEmployee *)0x0);
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar6 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar6,"loaded object is a myEmployeeBoss? :");
  if (local_278 == (myEmployee *)0x0) {
    bVar9 = false;
  }
  else {
    lVar7 = __dynamic_cast(local_278,&myEmployee::typeinfo,&myEmployeeBoss::typeinfo,0);
    bVar9 = lVar7 != 0;
  }
  pCVar6 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar6,bVar9);
  chrono::ChStreamOutAscii::operator<<(pCVar6,"\n");
  if (local_278 != (myEmployee *)0x0) {
    (*local_278->_vptr_myEmployee[1])();
  }
  if (local_2a8.
      super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (p_Stack_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_220);
  }
  if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
  }
  if (local_268.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_100.super_myEmployee._vptr_myEmployee = (_func_int **)&PTR__myEmployeeBoss_00158370;
  local_100.slave._vptr_myEmployee = (_func_int **)&PTR__myEmployee_001583a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.slave.name._M_dataplus._M_p != &local_100.slave.name.field_2) {
    operator_delete(local_100.slave.name._M_dataplus._M_p,
                    local_100.slave.name.field_2._M_allocated_capacity + 1);
  }
  local_100.super_myEmployee._vptr_myEmployee = (_func_int **)&PTR__myEmployee_001583a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.super_myEmployee.name._M_dataplus._M_p !=
      &local_100.super_myEmployee.name.field_2) {
    operator_delete(local_100.super_myEmployee.name._M_dataplus._M_p,
                    local_100.super_myEmployee.name.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != (ChVector<double> *)0x0) {
    free((void *)local_1d8[-1].m_data[2]);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_138);
  puVar3 = local_170;
  while (puVar3 != puVar1) {
    puVar2 = *(undefined1 **)puVar3;
    operator_delete(puVar3,0x28);
    puVar3 = puVar2;
  }
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,CONCAT71(local_1e8[0]._M_nxt._1_7_,local_1e8[0]._M_nxt._0_1_) + 1);
  }
  return;
}

Assistant:

void my_deserialization_example(ChArchiveIn& marchive)
{  
        // Read from persistent binary file to transient data
        double m_double;
        int m_int;
        double m_array[3];
        char m_text[12]; // better use std::string
        std::string m_string;
        std::vector< double > m_stlvector;
        std::list< ChVector<> > m_stllist;
        std::pair<int, double> m_stlpair;
        std::unordered_map<int, double> m_stlunorderedmap;
        ChMatrixDynamic<> m_matr_dyn;
		ChMatrixNM<double, 2,3> m_matr_NM;
        ChVector<> m_vect;
        ChQuaternion<> m_quat;
        myEmployeeBoss m_boss;
        ChVector<>* a_vect;
        ChVector<>* a_null_ptr;

        marchive >> CHNVP(m_double,"custom_double");  // deserialize data n.1
        marchive >> CHNVP(m_int);     // deserialize data n.2
        marchive >> CHNVP(m_array);   // deserialize data n.3
        marchive >> CHNVP(m_text);    // deserialize data n....
        marchive >> CHNVP(m_string);  
        marchive >> CHNVP(m_stlvector);
        marchive >> CHNVP(m_stllist);
        marchive >> CHNVP(m_stlpair);
        marchive >> CHNVP(m_stlunorderedmap);
        marchive >> CHNVP(m_matr_dyn);
		marchive >> CHNVP(m_matr_NM);
        marchive >> CHNVP(m_vect);  
        marchive >> CHNVP(m_quat, "m_quaternion", NVP_TRACK_OBJECT);        

        // Also deserialize the C++ object
        marchive >> CHNVP(m_boss); 

        // Also deserialize the C++ pointer: an object will be created!
        marchive >> CHNVP(a_vect); 

        // Also deserialize the null C++ pointer: no object is created, and pointer set as null.
        marchive >> CHNVP(a_null_ptr);

        // Also retrieve c++ objects, referenced by a base class pointer, using the
        // class abstraction (class factory) mechanism, so that it
        // can be loaded even if we do not know if it was an object of
        // the base class 'myEmployee' or the specialized 'myEmployeeBoss' class..
        myEmployee* a_boss = 0;
        marchive >> CHNVP(a_boss);  // object will be created

        // Since the two pointers a_boss and a_boss2 were serialized when pointing to 
        // the same object instance, now the following will Not create another copy but will
        // automatically point to the same object of a_boss. 
        myEmployee* a_boss2 = 0;
        marchive >> CHNVP(a_boss2); 


        // Deserialize c++ objects referenced by shared pointers.
        // If classes of pointed objects used CH_FACTORY_REGISTER, class abstraction
        // will be automatically used.
        std::shared_ptr<myEmployeeBoss> s_boss(0);
        marchive >> CHNVP(s_boss);

        // Deserialize a shared pointer pointing to the same resource of s_boss.
        // Since the two pointers s_boss and s_boss_b were serialized when pointing to 
        // the same object instance, do not create new, but just point to the same of s_boss. 
        // Also, the shared pointer reference count is increased automatically.
        std::shared_ptr<myEmployeeBoss> s_boss_b(0);
        marchive >> CHNVP(s_boss_b);

        // Deserialize a null shared pointer
        std::shared_ptr<myEmployeeBoss> null_boss(0);
        marchive >> CHNVP(null_boss);

        // Deserialize an object with non-default constructor:
        myEmployeeCustomConstructor* mcustomconstr = 0;
        marchive >> CHNVP(mcustomconstr); 

        // Deserialize an object where some pointers are re-linked from external pre-existing objects,
        // marking them with unique IDs. Assume a ChVector is already here. 
        std::vector<ChVector<>*> vect_of_pointers;
        ChVector<>* mvp1 = new ChVector<>(5,6,7);
        marchive.RebindExternalPointer(mvp1, 1001); // use unique identifier > 0
        marchive >> CHNVP(vect_of_pointers);



        // Just for safety, log some of the restored data:

        GetLog() << "\n\nSome results of deserialization I/O: \n\n" << m_text << " \n" << m_int << " \n" << m_double << "\n";
        GetLog() << m_matr_NM;
        GetLog() << m_vect;
        GetLog() << m_quat;
        GetLog() << m_string.c_str() << "\n";
        GetLog() << m_stlvector;
        GetLog() << m_stlpair;
        GetLog() << m_stlunorderedmap;
        GetLog() << m_boss;
        GetLog() << a_vect;

        if (a_boss) {
            GetLog() << "\n\n We loaded an obj inherited from myEmployee class:\n";
            GetLog() << a_boss;
        }
        if (a_boss2) {
            GetLog() << "\n\n We loaded a 2nd obj inherited from myEmployee class (referencing the 1st):\n";
            GetLog() << a_boss2;
        }
        if (s_boss) {
            GetLog() << "\n\n We loaded a 3nd obj inherited from myEmployee class:\n";
            GetLog() << s_boss;
            GetLog() << "(This object is handled by shared pointers, with ref.count=" << (int)s_boss.use_count() << ")\n";
        }
        if (!null_boss) {
            GetLog() << "\n\n We tried to load a 4th obj with shared pointer, but was null.\n";
        }
        if (mcustomconstr) {
            GetLog() << "\n\n We loaded a 5th object with non-default constructor with 2 parameters.\n";
            GetLog() << mcustomconstr;
        }
        GetLog() << "\n\n We loaded a 6th object where sub-objects were unbind/rebind using IDs:\n";
        GetLog() << vect_of_pointers;
        GetLog() << *vect_of_pointers[0];
        GetLog() << *vect_of_pointers[1];


        GetLog() << "\n";
        GetLog() << "loaded object is a myEmployee?     :" << (dynamic_cast<myEmployee*>(a_boss) !=nullptr) << "\n";
        GetLog() << "loaded object is a myEmployeeBoss? :" << (dynamic_cast<myEmployeeBoss*>(a_boss) !=nullptr) << "\n";

        delete a_boss;
}